

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyPointer
               (ResultCollector *result,QueriedState *state,void *expected)

{
  ostream *poVar1;
  ostringstream buf;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  if ((state->m_type == DATATYPE_POINTER) && ((void *)(state->m_v).vInt64 != expected)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,"Expected ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void verifyPointer (tcu::ResultCollector& result, QueriedState& state, const void* expected)
{
	switch (state.getType())
	{
		case DATATYPE_POINTER:
		{
			if (state.getPtrAccess() != expected)
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << state.getPtrAccess();
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}